

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O0

opj_tgt_tree_t * tgt_create(int numleafsh,int numleafsv)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  int iVar3;
  opj_tgt_tree_t *p_tree;
  opj_tgt_node_t *poVar4;
  OPJ_UINT32 in_ESI;
  OPJ_UINT32 in_EDI;
  int n;
  int numlvls;
  int k;
  int j;
  int i;
  opj_tgt_tree_t *tree;
  opj_tgt_node_t *parentnode0;
  opj_tgt_node_t *parentnode;
  opj_tgt_node_t *node;
  int nplv [32];
  int nplh [32];
  int local_148;
  OPJ_UINT32 local_144;
  uint local_140;
  int local_13c;
  opj_tgt_node *local_130;
  opj_tgt_node *local_128;
  opj_tgt_node_t *local_120;
  OPJ_UINT32 local_118 [32];
  OPJ_UINT32 local_98 [34];
  OPJ_UINT32 local_10;
  OPJ_UINT32 local_c;
  opj_tgt_tree_t *local_8;
  
  local_10 = in_ESI;
  local_c = in_EDI;
  p_tree = (opj_tgt_tree_t *)malloc(0x20);
  if (p_tree == (opj_tgt_tree_t *)0x0) {
    local_8 = (opj_tgt_tree_t *)0x0;
  }
  else {
    p_tree->numleafsh = local_c;
    p_tree->numleafsv = local_10;
    local_148 = 0;
    local_98[0] = local_c;
    local_118[0] = local_10;
    p_tree->numnodes = 0;
    iVar3 = local_148;
    do {
      local_148 = iVar3;
      OVar1 = local_98[local_148];
      OVar2 = local_118[local_148];
      local_98[local_148 + 1] = (int)(local_98[local_148] + 1) / 2;
      local_118[local_148 + 1] = (int)(local_118[local_148] + 1) / 2;
      p_tree->numnodes = OVar1 * OVar2 + p_tree->numnodes;
      iVar3 = local_148 + 1;
    } while (1 < (int)(OVar1 * OVar2));
    if (p_tree->numnodes == 0) {
      free(p_tree);
      local_8 = (opj_tgt_tree_t *)0x0;
    }
    else {
      poVar4 = (opj_tgt_node_t *)calloc((ulong)p_tree->numnodes,0x18);
      p_tree->nodes = poVar4;
      if (p_tree->nodes == (opj_tgt_node_t *)0x0) {
        free(p_tree);
        local_8 = (opj_tgt_tree_t *)0x0;
      }
      else {
        local_120 = p_tree->nodes;
        local_130 = p_tree->nodes + p_tree->numleafsh * p_tree->numleafsv;
        local_128 = local_130;
        for (local_13c = 0; local_13c < local_148; local_13c = local_13c + 1) {
          for (local_140 = 0; (int)local_140 < (int)local_118[local_13c]; local_140 = local_140 + 1)
          {
            local_144 = local_98[local_13c];
            while (-1 < (int)(local_144 - 1)) {
              local_120->parent = local_128;
              local_144 = local_144 - 2;
              poVar4 = local_120 + 1;
              if (-1 < (int)local_144) {
                local_120[1].parent = local_128;
                poVar4 = local_120 + 2;
              }
              local_120 = poVar4;
              local_128 = local_128 + 1;
            }
            if (((local_140 & 1) == 0) && (local_140 != local_118[local_13c] - 1)) {
              local_128 = local_130;
              local_130 = local_130 + (int)local_98[local_13c];
            }
            else {
              local_130 = local_128;
            }
          }
        }
        local_120->parent = (opj_tgt_node *)0x0;
        tgt_reset(p_tree);
        local_8 = p_tree;
      }
    }
  }
  return local_8;
}

Assistant:

opj_tgt_tree_t *tgt_create(int numleafsh, int numleafsv) {
	int nplh[32];
	int nplv[32];
	opj_tgt_node_t *node = NULL;
	opj_tgt_node_t *parentnode = NULL;
	opj_tgt_node_t *parentnode0 = NULL;
	opj_tgt_tree_t *tree = NULL;
	int i, j, k;
	int numlvls;
	int n;

	tree = (opj_tgt_tree_t *) opj_malloc(sizeof(opj_tgt_tree_t));
	if(!tree) return NULL;
	tree->numleafsh = numleafsh;
	tree->numleafsv = numleafsv;

	numlvls = 0;
	nplh[0] = numleafsh;
	nplv[0] = numleafsv;
	tree->numnodes = 0;
	do {
		n = nplh[numlvls] * nplv[numlvls];
		nplh[numlvls + 1] = (nplh[numlvls] + 1) / 2;
		nplv[numlvls + 1] = (nplv[numlvls] + 1) / 2;
		tree->numnodes += n;
		++numlvls;
	} while (n > 1);
	
	/* ADD */
	if (tree->numnodes == 0) {
		opj_free(tree);
		return NULL;
	}

	tree->nodes = (opj_tgt_node_t*) opj_calloc(tree->numnodes, sizeof(opj_tgt_node_t));
	if(!tree->nodes) {
		opj_free(tree);
		return NULL;
	}

	node = tree->nodes;
	parentnode = &tree->nodes[tree->numleafsh * tree->numleafsv];
	parentnode0 = parentnode;
	
	for (i = 0; i < numlvls - 1; ++i) {
		for (j = 0; j < nplv[i]; ++j) {
			k = nplh[i];
			while (--k >= 0) {
				node->parent = parentnode;
				++node;
				if (--k >= 0) {
					node->parent = parentnode;
					++node;
				}
				++parentnode;
			}
			if ((j & 1) || j == nplv[i] - 1) {
				parentnode0 = parentnode;
			} else {
				parentnode = parentnode0;
				parentnode0 += nplh[i];
			}
		}
	}
	node->parent = 0;
	
	tgt_reset(tree);
	
	return tree;
}